

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O0

OpCode __thiscall
Js::ByteCodeReader::ReadPrefixedOp
          (ByteCodeReader *this,byte **ip,LayoutSize *layoutSize,OpCode prefix)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode local_32;
  uint16 shortPrefix;
  uint16 nPrefixes;
  OpCode prefix_local;
  LayoutSize *layoutSize_local;
  byte **ip_local;
  ByteCodeReader *this_local;
  
  if (this->m_endLocation <= *ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x5d,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *layoutSize = prefix / 2;
  if ((prefix & ExtendedOpcodePrefix) == EndOfBlock) {
    local_32 = ReadByteOp(ip);
  }
  else {
    local_32 = ReadExtOp(ip);
  }
  return local_32;
}

Assistant:

OpCode ByteCodeReader::ReadPrefixedOp(const byte *&ip, LayoutSize& layoutSize, OpCode prefix) const
    {
        Assert(ip < m_endLocation);
        const uint16 nPrefixes = (uint16)Js::OpCode::Nop / LayoutCount;

        // Make sure the assumption made for the order of the prefix are right
        CompileAssert((uint16)Js::OpCode::ExtendedOpcodePrefix / nPrefixes == SmallLayout);
        CompileAssert((uint16)Js::OpCode::MediumLayoutPrefix / nPrefixes == MediumLayout);
        CompileAssert((uint16)Js::OpCode::ExtendedMediumLayoutPrefix / nPrefixes == MediumLayout);
        CompileAssert((uint16)Js::OpCode::LargeLayoutPrefix / nPrefixes == LargeLayout);
        CompileAssert((uint16)Js::OpCode::ExtendedLargeLayoutPrefix / nPrefixes == LargeLayout);

        CompileAssert((uint16)Js::OpCode::MediumLayoutPrefix % nPrefixes == 0);
        CompileAssert((uint16)Js::OpCode::LargeLayoutPrefix % nPrefixes == 0);
        CompileAssert((uint16)Js::OpCode::ExtendedOpcodePrefix % nPrefixes == 1);
        CompileAssert((uint16)Js::OpCode::ExtendedMediumLayoutPrefix % nPrefixes == 1);
        CompileAssert((uint16)Js::OpCode::ExtendedLargeLayoutPrefix % nPrefixes == 1);

        uint16 shortPrefix = (uint16)prefix;
        layoutSize = (LayoutSize)(shortPrefix / nPrefixes);
        return shortPrefix & 1 ? ReadExtOp(ip) : ReadByteOp(ip);
    }